

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

void __thiscall
ft::multiset<int,_ft::greater<int>,_ft::allocator<int>_>::clear
          (multiset<int,_ft::greater<int>,_ft::allocator<int>_> *this)

{
  iterator local_38;
  iterator local_20;
  
  local_38.m_tree =
       &(this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree;
  local_38.m_node =
       ((this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
        super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_first)->parent
  ;
  local_38._vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
  local_20.m_node =
       (this->super_setBase<int,_ft::greater<int>,_ft::allocator<int>_>).
       super_treeBase<int,_int,_int,_ft::greater<int>,_ft::allocator<int>_>.m_tree.m_last;
  local_20._vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcf0;
  local_20.m_tree = local_38.m_tree;
  erase(this,&local_38,&local_20);
  return;
}

Assistant:

void clear() {
		this->erase(this->begin(), this->end());
	}